

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

char * choc::text::FloatToStringBuffer<float>::writeAndGetEnd
                 (char *pos,float value,int maxDecimalPlaces)

{
  bool bVar1;
  uint32_t totalLength_00;
  char *pcVar2;
  size_t __n;
  MantissaAndExponent MVar3;
  MantissaAndExponent MVar4;
  MantissaAndExponent MVar5;
  MantissaAndExponent rhs;
  MantissaAndExponent rhs_00;
  int *in_stack_fffffffffffffee8;
  int local_10c;
  uint32_t totalLength;
  MantissaAndExponent lowerBound;
  MantissaAndExponent upperBound;
  MantissaAndExponent w;
  MantissaAndExponent powerOf10;
  int K;
  undefined1 local_58 [8];
  Limits limits;
  MantissaAndExponent v;
  uint64_t floatBits;
  int maxDecimalPlaces_local;
  float value_local;
  char *pos_local;
  
  v._8_8_ = getFloatBits(value);
  if ((v._8_8_ & 0x80000000) == 0) {
    bVar1 = isZero(v._8_8_);
    _maxDecimalPlaces_local = (FloatToStringBuffer<float> *)pos;
    if (bVar1) {
      pcVar2 = writeZero(pos);
      return pcVar2;
    }
  }
  else {
    _maxDecimalPlaces_local = (FloatToStringBuffer<float> *)write((int)pos,(void *)0x2d,__n);
    bVar1 = isZero(v._8_8_);
    if (bVar1) {
      pcVar2 = writeZero((char *)_maxDecimalPlaces_local);
      return pcVar2;
    }
    v._8_8_ = v._8_8_ & 0xffffffff7fffffff;
  }
  if (v._8_8_ == 0x7fc00000) {
    pos_local = write<char,char>(_maxDecimalPlaces_local->storage,'n','a','n');
  }
  else if (v._8_8_ == 0x7f800000) {
    pos_local = write<char,char>(_maxDecimalPlaces_local->storage,'i','n','f');
  }
  else {
    MVar3 = MantissaAndExponent::create(v._8_8_,v._8_8_ & 0x7fffff);
    limits.upper._8_8_ = MVar3.mantissa;
    MVar4._12_4_ = 0;
    MVar4.mantissa = SUB128(MVar3._0_12_,0);
    MVar4.exponent = SUB124(MVar3._0_12_,8);
    Limits::Limits((Limits *)local_58,MVar4);
    MVar3 = createPowerOf10((int)limits.upper.mantissa,(int *)&powerOf10.field_0xc);
    w._8_8_ = MVar3.mantissa;
    powerOf10.mantissa._0_4_ = MVar3.exponent;
    MVar3 = MantissaAndExponent::normalized((MantissaAndExponent *)&limits.upper.exponent);
    MVar5._12_4_ = 0;
    MVar5.mantissa = SUB128(MVar3._0_12_,0);
    MVar5.exponent = SUB124(MVar3._0_12_,8);
    MVar3 = MantissaAndExponent::operator*((MantissaAndExponent *)&w.exponent,MVar5);
    w.mantissa._0_4_ = MVar3.exponent;
    rhs.exponent = (int)limits.upper.mantissa;
    rhs.mantissa = limits.lower._8_8_;
    rhs._12_4_ = 0;
    MVar4 = MantissaAndExponent::operator*((MantissaAndExponent *)&w.exponent,rhs);
    pcVar2 = (char *)(MVar4.mantissa - 1);
    rhs_00.exponent = (undefined4)limits.lower.mantissa;
    rhs_00.mantissa = (uint64_t)local_58;
    rhs_00._12_4_ = 0;
    MVar5 = MantissaAndExponent::operator*((MantissaAndExponent *)&w.exponent,rhs_00);
    MVar3._8_8_ = (long)pcVar2 - MVar3.mantissa;
    MVar3.mantissa = (ulong)(uint)MVar4.exponent;
    totalLength_00 =
         generateDigits(_maxDecimalPlaces_local,pcVar2,MVar3,(long)pcVar2 - (MVar5.mantissa + 1),
                        (uint64_t)&powerOf10.field_0xc,in_stack_fffffffffffffee8);
    local_10c = maxDecimalPlaces;
    if (maxDecimalPlaces < 0) {
      local_10c = 0x144;
    }
    pos_local = addDecimalPointAndExponent
                          (_maxDecimalPlaces_local->storage,totalLength_00,powerOf10._12_4_,
                           local_10c);
  }
  return pos_local;
}

Assistant:

static const char* writeAndGetEnd (char* pos, FloatOrDouble value, int maxDecimalPlaces)
    {
        auto floatBits = getFloatBits (value);

        if ((floatBits & signMask) == 0)
        {
            if (isZero (floatBits))  return writeZero (pos);
        }
        else
        {
            pos = write (pos, '-');

            if (isZero (floatBits))  return writeZero (pos);

            value = -value;
            floatBits &= ~signMask;
        }

        if (floatBits == nanBits)  return write (pos, 'n', 'a', 'n');
        if (floatBits == infBits)  return write (pos, 'i', 'n', 'f');

        auto v = MantissaAndExponent::create (floatBits, floatBits & significandMask);
        Limits limits (v);

        int K;
        auto powerOf10 = createPowerOf10 (limits.upper.exponent, K);
        auto w = powerOf10 * v.normalized();
        auto upperBound = powerOf10 * limits.upper;
        upperBound.mantissa--;
        auto lowerBound = powerOf10 * limits.lower;
        lowerBound.mantissa++;

        auto totalLength = generateDigits (pos, upperBound, upperBound.mantissa - w.mantissa, upperBound.mantissa - lowerBound.mantissa, K);
        return addDecimalPointAndExponent (pos, totalLength, K, maxDecimalPlaces < 0 ? defaultNumDecimalPlaces : maxDecimalPlaces);
    }